

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_constant_expression.cpp
# Opt level: O3

bool constant_referenced(ir_dereference *deref,hash_table *variable_context,ir_constant **store,
                        int *offset)

{
  code cVar1;
  ir_node_type iVar2;
  exec_node *peVar3;
  glsl_type *pgVar4;
  ir_dereference *piVar5;
  _func_int *p_Var6;
  bool bVar7;
  uint uVar8;
  ir_constant *piVar9;
  hash_entry *phVar10;
  ir_dereference_variable *dv;
  int suboffset;
  ir_constant *substore;
  int local_34;
  ir_constant *local_30;
  
  *store = (ir_constant *)0x0;
  *offset = 0;
  if (variable_context == (hash_table *)0x0) {
    return false;
  }
  iVar2 = (deref->super_ir_rvalue).super_ir_instruction.ir_type;
  if (iVar2 == ir_type_dereference_variable) {
    phVar10 = _mesa_hash_table_search
                        (variable_context,
                         deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction);
    if (phVar10 == (hash_entry *)0x0) goto LAB_001e0ae8;
    piVar9 = (ir_constant *)phVar10->data;
  }
  else {
    if (iVar2 != ir_type_dereference_record) {
      if (iVar2 != ir_type_dereference_array) {
        __assert_fail("!\"Should not get here.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir_constant_expression.cpp"
                      ,0x231,
                      "bool constant_referenced(const ir_dereference *, struct hash_table *, ir_constant *&, int &)"
                     );
      }
      peVar3 = deref[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next;
      piVar9 = (ir_constant *)(*(code *)peVar3->next[3].next)(peVar3,variable_context,0);
      if ((piVar9 != (ir_constant *)0x0) &&
         (pgVar4 = (piVar9->super_ir_rvalue).type, uVar8 = *(uint *)&pgVar4->field_0x4,
         (uVar8 & 0xfe) == 0 && pgVar4->vector_elements == '\x01')) {
        if ((uVar8 & 1) == 0) {
          uVar8 = ir_constant::get_uint_component(piVar9,0);
        }
        else {
          uVar8 = ir_constant::get_int_component(piVar9,0);
        }
        piVar5 = (ir_dereference *)
                 deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
        if (((piVar5 != (ir_dereference *)0x0) &&
            ((piVar5->super_ir_rvalue).super_ir_instruction.ir_type < ir_type_constant)) &&
           (bVar7 = constant_referenced(piVar5,variable_context,&local_30,&local_34), bVar7)) {
          p_Var6 = deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction[4];
          cVar1 = p_Var6[4];
          if (cVar1 == (code)0x11) {
            piVar9 = ir_constant::get_array_element(local_30,uVar8);
            *store = piVar9;
            local_34 = 0;
          }
          else if ((byte)cVar1 - 2 < 3 && 1 < (byte)p_Var6[9]) {
            *store = local_30;
            local_34 = uVar8 * (byte)p_Var6[8];
          }
          else {
            if (((0xb < ((byte)cVar1 & 0xfc)) || (p_Var6[9] != (_func_int)0x1)) ||
               ((byte)p_Var6[8] < 2)) goto LAB_001e0ae8;
            *store = local_30;
            local_34 = uVar8 + local_34;
          }
          *offset = local_34;
        }
      }
      goto LAB_001e0ae8;
    }
    piVar5 = (ir_dereference *)deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
    if (((piVar5 == (ir_dereference *)0x0) ||
        (ir_type_dereference_variable < (piVar5->super_ir_rvalue).super_ir_instruction.ir_type)) ||
       (bVar7 = constant_referenced(piVar5,variable_context,&local_30,&local_34), !bVar7))
    goto LAB_001e0ae8;
    if (local_34 != 0) {
      __assert_fail("suboffset == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir_constant_expression.cpp"
                    ,0x220,
                    "bool constant_referenced(const ir_dereference *, struct hash_table *, ir_constant *&, int &)"
                   );
    }
    piVar9 = ir_constant::get_record_field
                       (local_30,*(int *)&deref[1].super_ir_rvalue.super_ir_instruction.
                                          super_exec_node.next);
  }
  *store = piVar9;
LAB_001e0ae8:
  return *store != (ir_constant *)0x0;
}

Assistant:

static bool
constant_referenced(const ir_dereference *deref,
                    struct hash_table *variable_context,
                    ir_constant *&store, int &offset)
{
   store = NULL;
   offset = 0;

   if (variable_context == NULL)
      return false;

   switch (deref->ir_type) {
   case ir_type_dereference_array: {
      const ir_dereference_array *const da =
         (const ir_dereference_array *) deref;

      ir_constant *const index_c =
         da->array_index->constant_expression_value(variable_context);

      if (!index_c || !index_c->type->is_scalar() ||
          !index_c->type->is_integer_32())
         break;

      const int index = index_c->type->base_type == GLSL_TYPE_INT ?
         index_c->get_int_component(0) :
         index_c->get_uint_component(0);

      ir_constant *substore;
      int suboffset;

      const ir_dereference *const deref = da->array->as_dereference();
      if (!deref)
         break;

      if (!constant_referenced(deref, variable_context, substore, suboffset))
         break;

      const glsl_type *const vt = da->array->type;
      if (vt->is_array()) {
         store = substore->get_array_element(index);
         offset = 0;
      } else if (vt->is_matrix()) {
         store = substore;
         offset = index * vt->vector_elements;
      } else if (vt->is_vector()) {
         store = substore;
         offset = suboffset + index;
      }

      break;
   }

   case ir_type_dereference_record: {
      const ir_dereference_record *const dr =
         (const ir_dereference_record *) deref;

      const ir_dereference *const deref = dr->record->as_dereference();
      if (!deref)
         break;

      ir_constant *substore;
      int suboffset;

      if (!constant_referenced(deref, variable_context, substore, suboffset))
         break;

      /* Since we're dropping it on the floor...
       */
      assert(suboffset == 0);

      store = substore->get_record_field(dr->field_idx);
      break;
   }

   case ir_type_dereference_variable: {
      const ir_dereference_variable *const dv =
         (const ir_dereference_variable *) deref;

      hash_entry *entry = _mesa_hash_table_search(variable_context, dv->var);
      if (entry)
         store = (ir_constant *) entry->data;
      break;
   }

   default:
      assert(!"Should not get here.");
      break;
   }

   return store != NULL;
}